

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O3

void __thiscall
pstore::database::database<pstore::file::in_memory>
          (database *this,shared_ptr<pstore::file::in_memory> *file,bool access_tick_enabled)

{
  system_page_size *this_00;
  pointer *__ptr;
  pointer __p;
  _Head_base<0UL,_pstore::system_page_size_interface_*,_false> local_38;
  unique_ptr<pstore::region::factory,_std::default_delete<pstore::region::factory>_> local_30;
  __uniq_ptr_impl<pstore::system_page_size,_std::default_delete<pstore::system_page_size>_> local_28
  ;
  
  this_00 = (system_page_size *)operator_new(0x10);
  (this_00->super_system_page_size_interface)._vptr_system_page_size_interface = (_func_int **)0x0;
  *(undefined8 *)&this_00->size_ = 0;
  system_page_size::system_page_size(this_00);
  local_28._M_t.
  super__Tuple_impl<0UL,_pstore::system_page_size_*,_std::default_delete<pstore::system_page_size>_>
  .super__Head_base<0UL,_pstore::system_page_size_*,_false>._M_head_impl =
       (tuple<pstore::system_page_size_*,_std::default_delete<pstore::system_page_size>_>)
       (_Tuple_impl<0UL,_pstore::system_page_size_*,_std::default_delete<pstore::system_page_size>_>
       )0x0;
  local_38._M_head_impl = (system_page_size_interface *)this_00;
  region::get_factory((region *)&local_30,file,0x100000000,0x400000);
  database<pstore::file::in_memory>
            (this,file,
             (unique_ptr<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
              *)&local_38,&local_30,access_tick_enabled);
  if (local_30._M_t.
      super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>.
      _M_t.
      super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>
      .super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>)0x0)
  {
    (**(code **)(*(long *)local_30._M_t.
                          super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>
                          .super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl + 8)
    )();
  }
  if ((system_page_size *)local_38._M_head_impl != (system_page_size *)0x0) {
    (*((system_page_size_interface *)&(local_38._M_head_impl)->_vptr_system_page_size_interface)->
      _vptr_system_page_size_interface[1])();
  }
  local_38._M_head_impl = (system_page_size_interface *)0x0;
  std::unique_ptr<pstore::system_page_size,_std::default_delete<pstore::system_page_size>_>::
  ~unique_ptr((unique_ptr<pstore::system_page_size,_std::default_delete<pstore::system_page_size>_>
               *)&local_28);
  return;
}

Assistant:

explicit database (std::shared_ptr<File> const & file, bool access_tick_enabled = true)
                : database (file, std::make_unique<system_page_size> (),
                            region::get_factory (file, storage::full_region_size,
                                                 storage::min_region_size),
                            access_tick_enabled) {}